

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tar_large.c
# Opt level: O2

ssize_t memory_read(archive *a,void *client_data,void **buff)

{
  void *pvVar1;
  long lVar2;
  
  pvVar1 = *(void **)((long)client_data + 8);
  *buff = pvVar1;
  lVar2 = *(long *)((long)client_data + 0x10) - (long)pvVar1;
  if (*(long *)((long)client_data + 0x18) <= lVar2) {
    lVar2 = *(long *)((long)client_data + 0x18);
  }
  *(long *)((long)client_data + 8) = (long)pvVar1 + lVar2;
  return lVar2;
}

Assistant:

static ssize_t
memory_read(struct archive *a, void *_private, const void **buff)
{
	struct memdata *private = _private;
	struct memblock *block;
	ssize_t size;

	(void)a;

	free(private->buff);
	private->buff = NULL;
	if (private->first == NULL) {
		private->last = NULL;
		return (ARCHIVE_EOF);
	}
	if (private->filebytes > 0) {
		/*
		 * We're returning file bytes, simulate it by
		 * passing blocks from the template data.
		 */
		if (private->filebytes > (int64_t)filedatasize)
			size = (ssize_t)filedatasize;
		else
			size = (ssize_t)private->filebytes;
		private->filebytes -= size;
		*buff = filedata;
	} else {
		/*
		 * We need to get some real data to return.
		 */
		block = private->first;
		private->first = block->next;
		size = (ssize_t)block->size;
		if (block->buff != NULL) {
			private->buff = block->buff;
			*buff = block->buff;
		} else {
			private->buff = NULL;
			*buff = filedata;
		}
		private->filebytes = block->filebytes;
		free(block);
	}
	return (size);
}